

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::SetTabItemClosed(char *label)

{
  ImGuiTabBar *pIVar1;
  ImGuiTabItem *pIVar2;
  ImU32 IVar3;
  ImGuiWindow *in_RDX;
  long lVar4;
  long lVar5;
  ImGuiTabBar *tab_bar;
  
  pIVar1 = GImGui->CurrentTabBar;
  if ((((pIVar1 != (ImGuiTabBar *)0x0) && (((uint)pIVar1->Flags >> 0x14 & 1) == 0)) &&
      (IVar3 = TabBarCalcTabID((ImGuiTabBar *)(ulong)(uint)pIVar1->Flags,label,in_RDX), IVar3 != 0))
     && (lVar4 = (long)(pIVar1->Tabs).Size, 0 < lVar4)) {
    pIVar2 = (pIVar1->Tabs).Data;
    lVar5 = 0;
    do {
      if (*(ImU32 *)((long)&pIVar2->ID + lVar5) == IVar3) {
        (&pIVar2->WantClose)[lVar5] = true;
        return;
      }
      lVar5 = lVar5 + 0x2c;
    } while (lVar4 * 0x2c - lVar5 != 0);
  }
  return;
}

Assistant:

void    ImGui::SetTabItemClosed(const char* label)
{
    ImGuiContext& g = *GImGui;
    bool is_within_manual_tab_bar = g.CurrentTabBar && !(g.CurrentTabBar->Flags & ImGuiTabBarFlags_DockNode);
    if (is_within_manual_tab_bar)
    {
        ImGuiTabBar* tab_bar = g.CurrentTabBar;
        ImGuiID tab_id = TabBarCalcTabID(tab_bar, label, NULL);
        if (ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, tab_id))
            tab->WantClose = true; // Will be processed by next call to TabBarLayout()
    }
}